

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O1

sizes xor8(size_t n)

{
  ulong *puVar1;
  undefined4 uVar2;
  size_t __size;
  undefined1 auVar3 [16];
  void *__ptr;
  uint64_t *keys;
  void *__s;
  void *__ptr_00;
  void *__ptr_01;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint32_t r0_2;
  ulong uVar21;
  undefined4 *puVar22;
  uint32_t r0;
  byte *pbVar23;
  uint uVar24;
  void *pvVar25;
  long lVar26;
  size_t sVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  sizes sVar32;
  ulong local_b8;
  ulong local_80;
  
  dVar28 = (double)(n & 0xffffffff) * 1.23 + 32.0;
  uVar7 = (ulong)dVar28;
  uVar7 = ((long)(dVar28 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7) / 3;
  __ptr = malloc(uVar7 * 3);
  if (__ptr == (void *)0x0) {
    uVar7 = 0;
  }
  if (__ptr == (void *)0x0) {
    puts("allocation failed");
    sVar14 = 0;
    sVar27 = 0;
    goto LAB_0010322f;
  }
  keys = (uint64_t *)malloc(n * 8);
  auVar3 = _DAT_00104060;
  if (n != 0) {
    lVar26 = n - 1;
    auVar29._8_4_ = (int)lVar26;
    auVar29._0_8_ = lVar26;
    auVar29._12_4_ = (int)((ulong)lVar26 >> 0x20);
    uVar8 = 0;
    auVar29 = auVar29 ^ _DAT_00104060;
    auVar30 = _DAT_00104050;
    do {
      auVar31 = auVar30 ^ auVar3;
      if ((bool)(~(auVar31._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar31._0_4_ ||
                  auVar29._4_4_ < auVar31._4_4_) & 1)) {
        keys[uVar8] = uVar8;
      }
      if ((auVar31._12_4_ != auVar29._12_4_ || auVar31._8_4_ <= auVar29._8_4_) &&
          auVar31._12_4_ <= auVar29._12_4_) {
        keys[uVar8 + 1] = uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar26 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 2;
      auVar30._8_8_ = lVar26 + 2;
    } while ((n + 1 & 0xfffffffffffffffe) != uVar8);
  }
  if ((int)n == 0) {
LAB_001031b7:
    puts("populating failed");
  }
  else {
    lVar26 = uVar7 * 0x10;
    __size = uVar7 * 0x30;
    __s = malloc(__size);
    __ptr_00 = malloc(__size);
    __ptr_01 = malloc((n & 0xffffffff) << 4);
    if (__ptr_01 == (void *)0x0 || (__ptr_00 == (void *)0x0 || __s == (void *)0x0)) {
LAB_00103193:
      free(__s);
      free(__ptr_00);
      free(__ptr_01);
      goto LAB_001031b7;
    }
    lVar4 = uVar7 * 0x20;
    uVar15 = uVar7 & 0xffffffff;
    local_80 = 0x9e3779b97f4a7c16;
    uVar5 = 0x910a2dec89025cc1;
    local_b8 = n;
    iVar6 = 0;
    while( true ) {
      if (iVar6 + 1 == 10) {
        local_b8 = xor_sort_and_remove_dup(keys,local_b8 & 0xffffffff);
      }
      if (iVar6 == 100) goto LAB_00103193;
      memset(__s,0,__size);
      uVar9 = local_b8 & 0xffffffff;
      if ((int)local_b8 != 0) {
        uVar10 = 0;
        do {
          uVar17 = (keys[uVar10] + uVar5 >> 0x21 ^ keys[uVar10] + uVar5) * -0xae502812aa7333;
          uVar19 = (uVar17 >> 0x21 ^ uVar17) * -0x3b314601e57a13ad;
          uVar17 = uVar19 >> 0x21 ^ uVar19;
          uVar21 = (uVar17 & 0xffffffff) * uVar15 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar21);
          *puVar1 = *puVar1 ^ uVar17;
          piVar12 = (int *)((long)__s + uVar21 + 8);
          *piVar12 = *piVar12 + 1;
          uVar19 = ((uint)(uVar17 << 0x15) | (uint)(uVar19 >> 0x2b)) * uVar15 >> 0x1c &
                   0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar19 + lVar26);
          *puVar1 = *puVar1 ^ uVar17;
          piVar12 = (int *)((long)__s + uVar19 + lVar26 + 8);
          *piVar12 = *piVar12 + 1;
          uVar19 = (uVar17 >> 0x16 & 0xffffffff) * uVar15 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar19 + lVar4);
          *puVar1 = *puVar1 ^ uVar17;
          piVar12 = (int *)((long)__s + uVar19 + lVar4 + 8);
          *piVar12 = *piVar12 + 1;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (uVar7 == 0) {
        lVar11 = 0;
      }
      else {
        lVar11 = 0;
        uVar5 = 0;
        piVar12 = (int *)((long)__s + 8);
        do {
          if (*piVar12 == 1) {
            *(int *)((long)__ptr_00 + lVar11 * 0x10 + 8) = (int)uVar5;
            *(undefined8 *)((long)__ptr_00 + lVar11 * 0x10) = *(undefined8 *)(piVar12 + -2);
            lVar11 = lVar11 + 1;
          }
          uVar5 = uVar5 + 1;
          piVar12 = piVar12 + 4;
        } while (uVar7 != uVar5);
      }
      if (uVar7 == 0) {
        lVar13 = 0;
      }
      else {
        lVar13 = 0;
        uVar5 = 0;
        piVar12 = (int *)((long)__s + lVar26 + 8);
        do {
          if (*piVar12 == 1) {
            *(int *)((long)__ptr_00 + lVar13 * 0x10 + lVar26 + 8) = (int)uVar5;
            *(undefined8 *)((long)__ptr_00 + lVar13 * 0x10 + lVar26) = *(undefined8 *)(piVar12 + -2)
            ;
            lVar13 = lVar13 + 1;
          }
          uVar5 = uVar5 + 1;
          piVar12 = piVar12 + 4;
        } while (uVar7 != uVar5);
      }
      if (uVar7 == 0) {
        lVar20 = 0;
      }
      else {
        lVar20 = 0;
        uVar5 = 0;
        piVar12 = (int *)((long)__s + lVar4 + 8);
        do {
          if (*piVar12 == 1) {
            *(int *)((long)__ptr_00 + lVar20 * 0x10 + lVar4 + 8) = (int)uVar5;
            *(undefined8 *)((long)__ptr_00 + lVar20 * 0x10 + lVar4) = *(undefined8 *)(piVar12 + -2);
            lVar20 = lVar20 + 1;
          }
          uVar5 = uVar5 + 1;
          piVar12 = piVar12 + 4;
        } while (uVar7 != uVar5);
      }
      uVar5 = 0;
      lVar18 = lVar13 + lVar11 + lVar20;
      while (lVar18 != 0) {
        if (lVar11 != 0) {
          puVar22 = (undefined4 *)((long)__ptr_00 + lVar11 * 0x10 + -4);
          do {
            uVar24 = puVar22[-1];
            if (*(int *)((long)__s + (ulong)uVar24 * 0x10 + 8) != 0) {
              uVar10 = *(ulong *)(puVar22 + -3);
              uVar2 = *puVar22;
              uVar17 = ((uint)(uVar10 << 0x15) | (uint)(uVar10 >> 0x2b)) * uVar15;
              lVar18 = uVar5 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar18) = uVar10;
              *(uint *)((long)__ptr_01 + lVar18 + 8) = uVar24;
              *(undefined4 *)((long)__ptr_01 + lVar18 + 0xc) = uVar2;
              lVar18 = (uVar17 >> 0x20) * 0x10;
              uVar19 = *(ulong *)((long)__s + lVar18 + lVar26) ^ uVar10;
              *(ulong *)((long)__s + lVar18 + lVar26) = uVar19;
              iVar16 = *(int *)((long)__s + lVar18 + lVar26 + 8) + -1;
              *(int *)((long)__s + lVar18 + lVar26 + 8) = iVar16;
              if (iVar16 == 1) {
                *(int *)((long)__ptr_00 + lVar13 * 0x10 + lVar26 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar13 * 0x10 + lVar26) = uVar19;
                lVar13 = lVar13 + 1;
              }
              uVar17 = (uVar10 >> 0x16 & 0xffffffff) * uVar15;
              uVar5 = uVar5 + 1;
              lVar18 = (uVar17 >> 0x20) * 0x10;
              uVar10 = uVar10 ^ *(ulong *)((long)__s + lVar18 + lVar4);
              *(ulong *)((long)__s + lVar18 + lVar4) = uVar10;
              iVar16 = *(int *)((long)__s + lVar18 + lVar4 + 8) + -1;
              *(int *)((long)__s + lVar18 + lVar4 + 8) = iVar16;
              if (iVar16 == 1) {
                *(int *)((long)__ptr_00 + lVar20 * 0x10 + lVar4 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar20 * 0x10 + lVar4) = uVar10;
                lVar20 = lVar20 + 1;
              }
            }
            lVar11 = lVar11 + -1;
            puVar22 = puVar22 + -4;
          } while (lVar11 != 0);
        }
        if (lVar13 == 0) {
          lVar11 = 0;
        }
        else {
          puVar22 = (undefined4 *)((long)__ptr_00 + lVar13 * 0x10 + lVar26 + -4);
          lVar11 = 0;
          do {
            uVar24 = puVar22[-1];
            if (*(int *)((long)__s + (ulong)uVar24 * 0x10 + lVar26 + 8) != 0) {
              uVar10 = *(ulong *)(puVar22 + -3);
              uVar2 = *puVar22;
              uVar17 = (uVar10 & 0xffffffff) * uVar15;
              lVar18 = uVar5 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar18) = uVar10;
              *(uint *)((long)__ptr_01 + lVar18 + 8) = uVar24 + (int)uVar7;
              *(undefined4 *)((long)__ptr_01 + lVar18 + 0xc) = uVar2;
              lVar18 = (uVar17 >> 0x20) * 0x10;
              uVar19 = *(ulong *)((long)__s + lVar18) ^ uVar10;
              *(ulong *)((long)__s + lVar18) = uVar19;
              iVar16 = *(int *)((long)__s + lVar18 + 8) + -1;
              *(int *)((long)__s + lVar18 + 8) = iVar16;
              if (iVar16 == 1) {
                *(int *)((long)__ptr_00 + lVar11 * 0x10 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar11 * 0x10) = uVar19;
                lVar11 = lVar11 + 1;
              }
              uVar17 = (uVar10 >> 0x16 & 0xffffffff) * uVar15;
              uVar5 = uVar5 + 1;
              lVar18 = (uVar17 >> 0x20) * 0x10;
              uVar10 = uVar10 ^ *(ulong *)((long)__s + lVar18 + lVar4);
              *(ulong *)((long)__s + lVar18 + lVar4) = uVar10;
              iVar16 = *(int *)((long)__s + lVar18 + lVar4 + 8) + -1;
              *(int *)((long)__s + lVar18 + lVar4 + 8) = iVar16;
              if (iVar16 == 1) {
                *(int *)((long)__ptr_00 + lVar20 * 0x10 + lVar4 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar20 * 0x10 + lVar4) = uVar10;
                lVar20 = lVar20 + 1;
              }
            }
            lVar13 = lVar13 + -1;
            puVar22 = puVar22 + -4;
          } while (lVar13 != 0);
        }
        if (lVar20 == 0) {
          lVar13 = 0;
        }
        else {
          puVar22 = (undefined4 *)((long)__ptr_00 + lVar20 * 0x10 + lVar4 + -4);
          lVar13 = 0;
          do {
            uVar24 = puVar22[-1];
            if (*(int *)((long)__s + (ulong)uVar24 * 0x10 + lVar4 + 8) != 0) {
              uVar10 = *(ulong *)(puVar22 + -3);
              uVar2 = *puVar22;
              uVar17 = (uVar10 & 0xffffffff) * uVar15;
              lVar18 = uVar5 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar18) = uVar10;
              *(uint *)((long)__ptr_01 + lVar18 + 8) = uVar24 + (int)uVar7 * 2;
              *(undefined4 *)((long)__ptr_01 + lVar18 + 0xc) = uVar2;
              lVar18 = (uVar17 >> 0x20) * 0x10;
              uVar19 = *(ulong *)((long)__s + lVar18) ^ uVar10;
              *(ulong *)((long)__s + lVar18) = uVar19;
              iVar16 = *(int *)((long)__s + lVar18 + 8) + -1;
              *(int *)((long)__s + lVar18 + 8) = iVar16;
              if (iVar16 == 1) {
                *(int *)((long)__ptr_00 + lVar11 * 0x10 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar11 * 0x10) = uVar19;
                lVar11 = lVar11 + 1;
              }
              uVar17 = ((uint)(uVar10 << 0x15) | (uint)(uVar10 >> 0x2b)) * uVar15;
              uVar5 = uVar5 + 1;
              lVar18 = (uVar17 >> 0x20) * 0x10;
              uVar10 = uVar10 ^ *(ulong *)((long)__s + lVar18 + lVar26);
              *(ulong *)((long)__s + lVar18 + lVar26) = uVar10;
              iVar16 = *(int *)((long)__s + lVar18 + lVar26 + 8) + -1;
              *(int *)((long)__s + lVar18 + lVar26 + 8) = iVar16;
              if (iVar16 == 1) {
                *(int *)((long)__ptr_00 + lVar13 * 0x10 + lVar26 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar13 * 0x10 + lVar26) = uVar10;
                lVar13 = lVar13 + 1;
              }
            }
            lVar20 = lVar20 + -1;
            puVar22 = puVar22 + -4;
          } while (lVar20 != 0);
        }
        lVar20 = 0;
        lVar18 = lVar11 + lVar13;
      }
      if (uVar5 == uVar9) break;
      local_80 = local_80 + 0x9e3779b97f4a7c15;
      uVar5 = (local_80 >> 0x1e ^ local_80) * -0x40a7b892e31b1a47;
      uVar5 = (uVar5 >> 0x1b ^ uVar5) * -0x6b2fb644ecceee15;
      uVar5 = uVar5 >> 0x1f ^ uVar5;
      iVar6 = iVar6 + 1;
    }
    if ((int)local_b8 != 0) {
      uVar5 = uVar7 & 0xffffffff;
      lVar26 = uVar9 << 4;
      do {
        uVar15 = *(ulong *)((long)__ptr_01 + lVar26 + -0x10);
        uVar9 = (ulong)*(uint *)((long)__ptr_01 + lVar26 + -8);
        uVar24 = (uint)(uVar15 >> 0x20);
        if (uVar9 < uVar7) {
          pbVar23 = (byte *)((((uint)(uVar15 << 0x15) | uVar24 >> 0xb) * uVar5 >> 0x20) +
                            (long)((long)__ptr + uVar7));
LAB_001038a4:
          uVar24 = (uint)(uVar15 >> 0x16);
          pvVar25 = (void *)(uVar7 * 2 + (long)__ptr);
        }
        else {
          if (uVar9 < uVar7 * 2) {
            pbVar23 = (byte *)(((uVar15 & 0xffffffff) * uVar5 >> 0x20) + (long)__ptr);
            goto LAB_001038a4;
          }
          pbVar23 = (byte *)(((uVar15 & 0xffffffff) * uVar5 >> 0x20) + (long)__ptr);
          uVar24 = (uint)(uVar15 << 0x15) | uVar24 >> 0xb;
          pvVar25 = (void *)((long)__ptr + uVar7);
        }
        *(byte *)((long)__ptr + uVar9) =
             (byte)(uVar15 >> 0x20) ^ (byte)uVar15 ^
             *(byte *)((long)pvVar25 + (uVar24 * uVar5 >> 0x20)) ^ *pbVar23;
        lVar26 = lVar26 + -0x10;
      } while (lVar26 != 0);
    }
    free(__s);
    free(__ptr_00);
    free(__ptr_01);
  }
  free(keys);
  sVar27 = (uVar7 * 3 + 7 >> 3) + 0x10;
  if (uVar7 != 0) {
    lVar26 = 0;
    do {
      sVar27 = (sVar27 + 1) - (ulong)(*(char *)((long)__ptr + lVar26) == '\0');
      lVar26 = lVar26 + 1;
    } while (uVar7 * 3 + (ulong)(uVar7 * 3 == 0) != lVar26);
  }
  sVar14 = uVar7 * 3 + 0x10;
  free(__ptr);
LAB_0010322f:
  sVar32.pack = sVar27;
  sVar32.standard = sVar14;
  return sVar32;
}

Assistant:

sizes xor8(size_t n) {
  xor8_t filter = {0};
  if (! xor8_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = xor8_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = xor8_serialization_bytes(&filter),
    .pack = xor8_pack_bytes(&filter)
  };
  xor8_free(&filter);

  return s;
}